

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

UINT8 __thiscall PlayerA::GetState(PlayerA *this)

{
  undefined1 uVar1;
  byte bVar2;
  
  if (this->_player != (PlayerBase *)0x0) {
    uVar1 = this->_myPlayState;
    bVar2 = uVar1 | 0x10;
    if (this->_fadeSmplStart == 0xffffffff) {
      bVar2 = uVar1;
    }
    return bVar2;
  }
  return '\0';
}

Assistant:

UINT8 PlayerA::GetState(void) const
{
	if (_player == NULL)
		return 0x00;
	UINT8 finalState = _myPlayState;
	if (_fadeSmplStart != (UINT32)-1)
		finalState |= PLAYSTATE_FADE;
	return finalState;
}